

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke_test.cc
# Opt level: O0

void __thiscall
bssl::HPKETest_InvalidP256PrivateKey_Test::~HPKETest_InvalidP256PrivateKey_Test
          (HPKETest_InvalidP256PrivateKey_Test *this)

{
  HPKETest_InvalidP256PrivateKey_Test *this_local;
  
  ~HPKETest_InvalidP256PrivateKey_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HPKETest, InvalidP256PrivateKey) {
  const uint8_t zero_key[32] = {0};
  ScopedEVP_HPKE_KEY key;
  EXPECT_FALSE(EVP_HPKE_KEY_init(key.get(), EVP_hpke_p256_hkdf_sha256(),
                                 zero_key, sizeof(zero_key)));

  uint8_t all_ones_key[32];
  OPENSSL_memset(all_ones_key, 0xff, sizeof(all_ones_key));
  EXPECT_FALSE(EVP_HPKE_KEY_init(key.get(), EVP_hpke_p256_hkdf_sha256(),
                                 all_ones_key, sizeof(all_ones_key)));
}